

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

int chaiscript::dispatch::detail::call_func<std::function<int(int)>,int,int,0ul>
              (undefined8 param_1,function<int_(int)> *param_2,undefined8 *param_3,
              Type_Conversions_State *param_4)

{
  int iVar1;
  
  iVar1 = boxed_cast<int>((Boxed_Value *)*param_3,param_4);
  iVar1 = std::function<int_(int)>::operator()(param_2,iVar1);
  return iVar1;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }